

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void statement(LexState *ls)

{
  uint uVar1;
  l_uint32 *plVar2;
  FuncState *pFVar3;
  Instruction *pIVar4;
  bool bVar5;
  byte bVar6;
  lu_byte lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint first;
  BlockCnt *pBVar13;
  LocVar *pLVar14;
  TString *pTVar15;
  Labeldesc *pLVar16;
  TString *pTVar17;
  char *pcVar18;
  FuncState *pFVar19;
  char **ppcVar20;
  Vardesc *v;
  BlockCnt bl1;
  BlockCnt local_48;
  
  iVar8 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar10 = (ls->t).token;
  switch(iVar10) {
  case 0x101:
    pBVar13 = (BlockCnt *)&ls->fs->bl;
    do {
      pBVar13 = pBVar13->previous;
      if (pBVar13 == (BlockCnt *)0x0) {
        pcVar18 = "break outside loop";
        goto LAB_00113149;
      }
    } while (pBVar13->isloop == '\0');
    pBVar13->isloop = '\x02';
    luaX_next(ls);
    pTVar15 = luaS_newlstr(ls->L,"break",5);
    goto LAB_00112a64;
  case 0x102:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar8);
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10b:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x112:
  case 0x113:
  case 0x114:
    goto switchD_0011272a_caseD_103;
  case 0x107:
    pFVar19 = ls->fs;
    iVar9 = 1;
    enterblock(pFVar19,&local_48,'\x01');
    luaX_next(ls);
    pTVar15 = str_checkname(ls);
    iVar10 = (ls->t).token;
    if ((iVar10 == 0x2c) || (iVar10 == 0x10b)) {
      pFVar3 = ls->fs;
      bVar6 = pFVar3->freereg;
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      new_localvarkind(ls,pTVar15,'\x01');
      while (iVar10 = testnext(ls,0x2c), iVar10 != 0) {
        pTVar15 = str_checkname(ls);
        new_localvar(ls,pTVar15);
        iVar9 = iVar9 + 1;
      }
      checknext(ls,0x10b);
      iVar10 = ls->linenumber;
      iVar11 = explist(ls,(expdesc *)&bl1);
      adjust_assign(ls,4,iVar11,(expdesc *)&bl1);
      adjustlocalvars(ls,3);
      pBVar13 = pFVar3->bl;
      pBVar13->upval = '\x01';
      pBVar13->insidetbc = '\x01';
      pFVar3->needclose = '\x01';
      luaK_checkstack(pFVar3,2);
      forbody(ls,(uint)bVar6,iVar10,iVar9,1);
    }
    else {
      if (iVar10 != 0x3d) {
        pcVar18 = "\'=\' or \'in\' expected";
        goto LAB_00113149;
      }
      pFVar3 = ls->fs;
      bVar6 = pFVar3->freereg;
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      new_localvarkind(ls,pTVar15,'\x01');
      checknext(ls,0x3d);
      exp1(ls);
      checknext(ls,0x2c);
      exp1(ls);
      iVar10 = testnext(ls,0x2c);
      if (iVar10 == 0) {
        luaK_int(pFVar3,(uint)pFVar3->freereg,1);
        luaK_reserveregs(pFVar3,1);
      }
      else {
        exp1(ls);
      }
      adjustlocalvars(ls,2);
      forbody(ls,(uint)bVar6,iVar8,1,0);
    }
    check_match(ls,0x105,0x107,iVar8);
    goto LAB_001130b8;
  case 0x108:
    luaX_next(ls);
    singlevar(ls,(expdesc *)&bl1);
    while (iVar10 = (ls->t).token, iVar10 == 0x2e) {
      fieldsel(ls,(expdesc *)&bl1);
    }
    if (iVar10 == 0x3a) {
      fieldsel(ls,(expdesc *)&bl1);
    }
    body(ls,(expdesc *)&local_48,(uint)(iVar10 == 0x3a),iVar8);
    check_readonly(ls,(expdesc *)&bl1);
    luaK_storevar(ls->fs,(expdesc *)&bl1,(expdesc *)&local_48);
    luaK_fixline(ls->fs,iVar8);
    break;
  case 0x109:
    luaX_next(ls);
    pTVar15 = str_checkname(ls);
LAB_00112a64:
    newgotoentry(ls,pTVar15,iVar8);
    break;
  case 0x10a:
    pFVar19 = ls->fs;
    bl1.previous = (BlockCnt *)CONCAT44(bl1.previous._4_4_,0xffffffff);
    do {
      pFVar3 = ls->fs;
      luaX_next(ls);
      iVar10 = cond(ls);
      checknext(ls,0x112);
      block(ls);
      if ((ls->t).token - 0x103U < 2) {
        iVar9 = luaK_jump(pFVar3);
        luaK_concat(pFVar3,(int *)&bl1,iVar9);
      }
      luaK_patchtohere(pFVar3,iVar10);
    } while ((ls->t).token == 0x104);
    iVar10 = testnext(ls,0x103);
    if (iVar10 != 0) {
      block(ls);
    }
    check_match(ls,0x105,0x10a,iVar8);
    iVar10 = (uint)bl1.previous;
    goto LAB_00112c11;
  case 0x10c:
    luaX_next(ls);
    iVar8 = testnext(ls,0x108);
    if (iVar8 == 0) {
      pFVar19 = ls->fs;
      iVar8 = -1;
      iVar10 = 0;
      do {
        iVar9 = iVar10;
        pTVar15 = str_checkname(ls);
        iVar10 = testnext(ls,0x3c);
        if (iVar10 == 0) {
          bVar5 = false;
          lVar7 = '\0';
        }
        else {
          pTVar17 = str_checkname(ls);
          ppcVar20 = &pTVar17->contents;
          if (pTVar17->shrlen < '\0') {
            ppcVar20 = (char **)*ppcVar20;
          }
          checknext(ls,0x3e);
          iVar10 = strcmp((char *)ppcVar20,"const");
          if (iVar10 == 0) {
            lVar7 = '\x01';
            bVar5 = false;
          }
          else {
            iVar10 = strcmp((char *)ppcVar20,"close");
            if (iVar10 != 0) {
              pcVar18 = luaO_pushfstring(ls->L,"unknown attribute \'%s\'",ppcVar20);
              goto LAB_00113137;
            }
            lVar7 = '\x02';
            bVar5 = true;
          }
        }
        iVar11 = new_localvarkind(ls,pTVar15,lVar7);
        if (bVar5) {
          if (iVar8 != -1) {
            luaK_semerror(ls,"multiple to-be-closed variables in local list");
          }
          iVar8 = (uint)pFVar19->nactvar + iVar9;
        }
        iVar10 = iVar9 + 1;
        iVar12 = testnext(ls,0x2c);
      } while (iVar12 != 0);
      iVar12 = testnext(ls,0x3d);
      if (iVar12 == 0) {
        bl1.previous = (BlockCnt *)((ulong)bl1.previous & 0xffffffff00000000);
        iVar12 = 0;
      }
      else {
        iVar12 = explist(ls,(expdesc *)&bl1);
      }
      if (((iVar12 == iVar10) &&
          (v = (pFVar19->ls->dyd->actvar).arr + (long)iVar11 + (long)pFVar19->firstlocal,
          (v->vd).kind == '\x01')) &&
         (iVar11 = luaK_exp2const(pFVar19,(expdesc *)&bl1,&v->k), iVar11 != 0)) {
        (v->vd).kind = '\x03';
        adjustlocalvars(ls,iVar9);
        pFVar19->nactvar = pFVar19->nactvar + '\x01';
      }
      else {
        adjust_assign(ls,iVar10,iVar12,(expdesc *)&bl1);
        adjustlocalvars(ls,iVar10);
      }
      if (iVar8 != -1) {
        pBVar13 = pFVar19->bl;
        pBVar13->upval = '\x01';
        pBVar13->insidetbc = '\x01';
        pFVar19->needclose = '\x01';
        bVar6 = reglevel(pFVar19,iVar8);
        luaK_codeABCk(pFVar19,OP_TBC,(uint)bVar6,0,0,0);
      }
    }
    else {
      pFVar19 = ls->fs;
      bVar6 = pFVar19->nactvar;
      pTVar15 = str_checkname(ls);
      new_localvar(ls,pTVar15);
      adjustlocalvars(ls,1);
      body(ls,(expdesc *)&bl1,0,ls->linenumber);
      iVar8 = pFVar19->pc;
      pLVar14 = localdebuginfo(pFVar19,(uint)bVar6);
      pLVar14->startpc = iVar8;
    }
    break;
  case 0x110:
    pFVar19 = ls->fs;
    iVar10 = luaK_getlabel(pFVar19);
    enterblock(pFVar19,&bl1,'\x01');
    enterblock(pFVar19,&local_48,'\0');
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x114,0x110,iVar8);
    iVar8 = cond(ls);
    leaveblock(pFVar19);
    if (local_48.upval != '\0') {
      iVar9 = luaK_jump(pFVar19);
      luaK_patchtohere(pFVar19,iVar8);
      bVar6 = reglevel(pFVar19,(uint)local_48.nactvar);
      luaK_codeABCk(pFVar19,OP_CLOSE,(uint)bVar6,0,0,0);
      iVar8 = luaK_jump(pFVar19);
      luaK_patchtohere(pFVar19,iVar9);
    }
    luaK_patchlist(pFVar19,iVar8,iVar10);
LAB_001130b8:
    leaveblock(pFVar19);
    break;
  case 0x111:
    luaX_next(ls);
    pFVar19 = ls->fs;
    bVar6 = luaY_nvarstack(pFVar19);
    first = (uint)bVar6;
    iVar8 = (ls->t).token;
    uVar1 = iVar8 - 0x103;
    iVar10 = 0;
    if (((0x1d < uVar1) || ((0x20020007U >> (uVar1 & 0x1f) & 1) == 0)) && (iVar8 != 0x3b)) {
      iVar10 = explist(ls,(expdesc *)&bl1);
      if (((uint)bl1.previous & 0xfffffffe) == 0x12) {
        iVar8 = -1;
        luaK_setreturns(pFVar19,(expdesc *)&bl1,-1);
        bVar5 = iVar10 == 1;
        iVar10 = iVar8;
        if ((bVar5 && (uint)bl1.previous == 0x12) && (pFVar19->bl->insidetbc == '\0')) {
          pIVar4 = pFVar19->f->code;
          pIVar4[bl1.firstlabel] = pIVar4[bl1.firstlabel] & 0xffffff80 | 0x45;
        }
      }
      else if (iVar10 == 1) {
        first = luaK_exp2anyreg(pFVar19,(expdesc *)&bl1);
        iVar10 = 1;
      }
      else {
        luaK_exp2nextreg(pFVar19,(expdesc *)&bl1);
      }
    }
    luaK_ret(pFVar19,first,iVar10);
    testnext(ls,0x3b);
    break;
  case 0x115:
    pFVar19 = ls->fs;
    luaX_next(ls);
    iVar9 = luaK_getlabel(pFVar19);
    iVar10 = cond(ls);
    enterblock(pFVar19,&bl1,'\x01');
    checknext(ls,0x102);
    block(ls);
    iVar11 = luaK_jump(pFVar19);
    luaK_patchlist(pFVar19,iVar11,iVar9);
    check_match(ls,0x105,0x115,iVar8);
    leaveblock(pFVar19);
LAB_00112c11:
    luaK_patchtohere(pFVar19,iVar10);
    break;
  default:
    if (iVar10 == 0x11f) {
      luaX_next(ls);
      pTVar15 = str_checkname(ls);
      checknext(ls,0x11f);
      while ((iVar10 = (ls->t).token, iVar10 == 0x11f || (iVar10 == 0x3b))) {
        statement(ls);
      }
      pLVar16 = findlabel(ls,pTVar15,ls->fs->firstlabel);
      if (pLVar16 != (Labeldesc *)0x0) {
        ppcVar20 = &pTVar15->contents;
        if (pTVar15->shrlen < '\0') {
          ppcVar20 = (char **)*ppcVar20;
        }
        pcVar18 = luaO_pushfstring(ls->L,"label \'%s\' already defined on line %d",ppcVar20,
                                   (ulong)(uint)pLVar16->line);
LAB_00113137:
        luaK_semerror(ls,pcVar18);
      }
      iVar9 = 1;
      if ((2 < iVar10 - 0x103U) && (iVar10 != 0x120)) {
        iVar9 = 0;
      }
      createlabel(ls,pTVar15,iVar8,iVar9);
      break;
    }
    if (iVar10 == 0x3b) {
      luaX_next(ls);
      break;
    }
    goto switchD_0011272a_caseD_103;
  }
LAB_001130bd:
  pFVar19 = ls->fs;
  lVar7 = luaY_nvarstack(pFVar19);
  pFVar19->freereg = lVar7;
  plVar2 = &ls->L->nCcalls;
  *plVar2 = *plVar2 - 1;
  return;
switchD_0011272a_caseD_103:
  pFVar19 = ls->fs;
  suffixedexp(ls,(expdesc *)&bl1.firstlabel);
  iVar8 = (ls->t).token;
  if ((iVar8 == 0x3d) || (iVar8 == 0x2c)) {
    bl1.previous = (BlockCnt *)0x0;
    restassign(ls,(LHS_assign *)&bl1,1);
  }
  else {
    if (bl1.firstlabel != 0x12) {
      pcVar18 = "syntax error";
LAB_00113149:
      luaX_syntaxerror(ls,pcVar18);
    }
    *(undefined1 *)((long)pFVar19->f->code + (long)(int)bl1._16_4_ * 4 + 3) = 1;
  }
  goto LAB_001130bd;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls, line);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls, line);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}